

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ed.c
# Opt level: O1

void ed_dual_scale(ed *R,limb_t *x,limb_t *y,ed *Q)

{
  int iVar1;
  int i;
  int iVar2;
  long lVar3;
  ed *peVar4;
  pced *ppVar5;
  bool bVar6;
  fld_t d;
  fld_t b;
  fld_t a;
  fld_t c;
  fld_t h;
  fld_t g;
  fld_t f;
  fld_t e;
  pced pcQ;
  ed QmB;
  ed QpB;
  int uy [261];
  int ux [261];
  limb_t local_b98 [6];
  limb_t local_b68 [6];
  limb_t local_b38 [6];
  limb_t local_b08 [6];
  limb_t local_ad8 [6];
  limb_t local_aa8 [6];
  limb_t local_a78 [6];
  limb_t local_a48 [5];
  pced local_a20;
  ed local_9a8;
  ed local_908;
  int local_868 [264];
  int local_448 [262];
  
  memcpy(R,&ed_zero,0xa0);
  iVar2 = sc_jsf(local_448,local_868,x,y);
  if (iVar2 == -1) {
    return;
  }
  ed_add_pc(&local_908,Q,&pced_B);
  ed_sub_pc(&local_9a8,Q,&pced_B);
  lVar3 = 0;
  do {
    local_a20.diff[lVar3] = Q->y[lVar3] - Q->x[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 5);
  lVar3 = 5;
  do {
    local_a20.diff[lVar3] = Q->x[lVar3 + -5] + Q->x[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 10);
  fld_mul(local_a20.prod,Q->t,con_2d);
  do {
    iVar1 = local_868[iVar2];
    if (local_448[iVar2] == -1) {
      if (iVar1 == -1) {
        peVar4 = &local_908;
LAB_001033dd:
        ed_sub(R,R,peVar4);
      }
      else {
        if (iVar1 != 1) {
          ppVar5 = &pced_B;
          goto LAB_00103409;
        }
        peVar4 = &local_9a8;
LAB_001033aa:
        ed_add(R,R,peVar4);
      }
    }
    else {
      if (local_448[iVar2] == 1) {
        if (iVar1 == -1) {
          peVar4 = &local_9a8;
          goto LAB_001033dd;
        }
        if (iVar1 == 1) {
          peVar4 = &local_908;
          goto LAB_001033aa;
        }
        ppVar5 = &pced_B;
      }
      else {
        if (iVar1 == -1) {
          ppVar5 = &local_a20;
LAB_00103409:
          ed_sub_pc(R,R,ppVar5);
          goto LAB_0010340e;
        }
        if (iVar1 != 1) goto LAB_0010340e;
        ppVar5 = &local_a20;
      }
      ed_add_pc(R,R,ppVar5);
    }
LAB_0010340e:
    bVar6 = iVar2 == 0;
    iVar2 = iVar2 + -1;
    if (bVar6) {
      return;
    }
    lVar3 = 0;
    do {
      local_b38[lVar3] = R->y[lVar3] - R->x[lVar3];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 5);
    fld_sq(local_b38,local_b38);
    lVar3 = 0;
    do {
      local_b68[lVar3] = R->x[lVar3] + R->y[lVar3];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 5);
    fld_sq(local_b68,local_b68);
    fld_sq(local_b08,R->t);
    fld_mul(local_b08,local_b08,con_2d);
    fld_sq(local_b98,R->z);
    lVar3 = 0;
    do {
      local_b98[lVar3] = local_b98[lVar3] << 1;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 5);
    lVar3 = 0;
    do {
      local_a48[lVar3] = local_b68[lVar3] - local_b38[lVar3];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 5);
    lVar3 = 0;
    do {
      local_a78[lVar3] = local_b98[lVar3] - local_b08[lVar3];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 5);
    lVar3 = 0;
    do {
      local_aa8[lVar3] = local_b08[lVar3] + local_b98[lVar3];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 5);
    lVar3 = 0;
    do {
      local_ad8[lVar3] = local_b38[lVar3] + local_b68[lVar3];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 5);
    fld_mul(R->x,local_a48,local_a78);
    fld_mul(R->y,local_aa8,local_ad8);
    fld_mul(R->t,local_a48,local_ad8);
    fld_mul(R->z,local_a78,local_aa8);
  } while( true );
}

Assistant:

void
ed_dual_scale(struct ed *R,
	      const sc_t x,
	      const sc_t y, const struct ed *Q)
{
	struct ed QpB, QmB;
	struct pced pcQ;

	int ux[SC_BITS+1], uy[SC_BITS+1];
	int n, i;

	memcpy(R, &ed_zero, sizeof(struct ed));

	/* calculate joint sparse form of x and y */
	n = sc_jsf(ux, uy, x, y);
	if (n == -1)
		return;

	/* precompute Q, Q+B and Q-B */
	ed_add_pc(&QpB, Q, &pced_B);
	ed_sub_pc(&QmB, Q, &pced_B);
	ed_precompute(&pcQ, Q);
	
	/* now we calculate R = x * base_point + y * Q using fast shamir method */
	for (i = n; ; i--) {
		if (ux[i] == 1) {
			if (uy[i] == 1)
				ed_add(R, R, &QpB);
			else if (uy[i] == -1)
				ed_sub(R, R, &QmB);
			else
				ed_add_pc(R, R, &pced_B);
			
		} else if (ux[i] == -1) {
			if (uy[i] == 1)
				ed_add(R, R, &QmB);
			else if (uy[i] == -1)
				ed_sub(R, R, &QpB);
			else
				ed_sub_pc(R, R, &pced_B);

		} else {
			if (uy[i] == 1)
				ed_add_pc(R, R, &pcQ);
			else if (uy[i] == -1)
				ed_sub_pc(R, R, &pcQ);
		}

		if (i == 0) break;

		ed_double(R, R);
	}
}